

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void qtree_copy(uchar *a,int nx,int ny,uchar *b,int n)

{
  int iVar1;
  int s10;
  int s00;
  int ny2;
  int nx2;
  int k;
  int j;
  int i;
  int n_local;
  uchar *b_local;
  int ny_local;
  int nx_local;
  uchar *a_local;
  
  i = (nx + 1) / 2;
  iVar1 = (ny + 1) / 2;
  k = iVar1 * (i + -1) + iVar1 + -1;
  while (i = i + -1, -1 < i) {
    s00 = (n * i + iVar1 + -1) * 2;
    j = iVar1;
    while (j = j + -1, -1 < j) {
      b[s00] = a[k];
      k = k + -1;
      s00 = s00 + -2;
    }
  }
  for (i = 0; i < nx + -1; i = i + 2) {
    s00 = n * i;
    s10 = s00 + n;
    for (j = 0; j < ny + -1; j = j + 2) {
      switch(b[s00]) {
      case '\0':
        b[s10 + 1] = '\0';
        b[s10] = '\0';
        b[s00 + 1] = '\0';
        b[s00] = '\0';
        break;
      case '\x01':
        b[s10 + 1] = '\x01';
        b[s10] = '\0';
        b[s00 + 1] = '\0';
        b[s00] = '\0';
        break;
      case '\x02':
        b[s10 + 1] = '\0';
        b[s10] = '\x01';
        b[s00 + 1] = '\0';
        b[s00] = '\0';
        break;
      case '\x03':
        b[s10 + 1] = '\x01';
        b[s10] = '\x01';
        b[s00 + 1] = '\0';
        b[s00] = '\0';
        break;
      case '\x04':
        b[s10 + 1] = '\0';
        b[s10] = '\0';
        b[s00 + 1] = '\x01';
        b[s00] = '\0';
        break;
      case '\x05':
        b[s10 + 1] = '\x01';
        b[s10] = '\0';
        b[s00 + 1] = '\x01';
        b[s00] = '\0';
        break;
      case '\x06':
        b[s10 + 1] = '\0';
        b[s10] = '\x01';
        b[s00 + 1] = '\x01';
        b[s00] = '\0';
        break;
      case '\a':
        b[s10 + 1] = '\x01';
        b[s10] = '\x01';
        b[s00 + 1] = '\x01';
        b[s00] = '\0';
        break;
      case '\b':
        b[s10 + 1] = '\0';
        b[s10] = '\0';
        b[s00 + 1] = '\0';
        b[s00] = '\x01';
        break;
      case '\t':
        b[s10 + 1] = '\x01';
        b[s10] = '\0';
        b[s00 + 1] = '\0';
        b[s00] = '\x01';
        break;
      case '\n':
        b[s10 + 1] = '\0';
        b[s10] = '\x01';
        b[s00 + 1] = '\0';
        b[s00] = '\x01';
        break;
      case '\v':
        b[s10 + 1] = '\x01';
        b[s10] = '\x01';
        b[s00 + 1] = '\0';
        b[s00] = '\x01';
        break;
      case '\f':
        b[s10 + 1] = '\0';
        b[s10] = '\0';
        b[s00 + 1] = '\x01';
        b[s00] = '\x01';
        break;
      case '\r':
        b[s10 + 1] = '\x01';
        b[s10] = '\0';
        b[s00 + 1] = '\x01';
        b[s00] = '\x01';
        break;
      case '\x0e':
        b[s10 + 1] = '\0';
        b[s10] = '\x01';
        b[s00 + 1] = '\x01';
        b[s00] = '\x01';
        break;
      case '\x0f':
        b[s10 + 1] = '\x01';
        b[s10] = '\x01';
        b[s00 + 1] = '\x01';
        b[s00] = '\x01';
      }
      s00 = s00 + 2;
      s10 = s10 + 2;
    }
    if (j < ny) {
      b[s10] = (byte)((int)(uint)b[s00] >> 1) & 1;
      b[s00] = (byte)((int)(uint)b[s00] >> 3) & 1;
    }
  }
  if (i < nx) {
    s00 = n * i;
    for (j = 0; j < ny + -1; j = j + 2) {
      b[s00 + 1] = (byte)((int)(uint)b[s00] >> 2) & 1;
      b[s00] = (byte)((int)(uint)b[s00] >> 3) & 1;
      s00 = s00 + 2;
    }
    if (j < ny) {
      b[s00] = (byte)((int)(uint)b[s00] >> 3) & 1;
    }
  }
  return;
}

Assistant:

static void
qtree_copy(unsigned char a[], int nx, int ny, unsigned char b[], int n)
/*   int n;		declared y dimension of b */
{
int i, j, k, nx2, ny2;
int s00, s10;

	/*
	 * first copy 4-bit values to b
	 * start at end in case a,b are same array
	 */
	nx2 = (nx+1)/2;
	ny2 = (ny+1)/2;
	k = ny2*(nx2-1)+ny2-1;			/* k   is index of a[i,j]		*/
	for (i = nx2-1; i >= 0; i--) {
		s00 = 2*(n*i+ny2-1);		/* s00 is index of b[2*i,2*j]		*/
		for (j = ny2-1; j >= 0; j--) {
			b[s00] = a[k];
			k -= 1;
			s00 -= 2;
		}
	}
	/*
	 * now expand each 2x2 block
	 */
	for (i = 0; i<nx-1; i += 2) {

  /* Note:
     Unlike the case in qtree_bitins, this code runs faster on a 32-bit linux
     machine using the s10 intermediate variable, rather that using s00+n. 
     Go figure!
  */
		s00 = n*i;				/* s00 is index of b[i,j]	*/
		s10 = s00+n;				/* s10 is index of b[i+1,j]	*/

		for (j = 0; j<ny-1; j += 2) {

		    switch (b[s00]) {
		    case(0):
			b[s10+1] = 0;
			b[s10  ] = 0;
			b[s00+1] = 0;
			b[s00  ] = 0;

			break;
		    case(1):
			b[s10+1] = 1;
			b[s10  ] = 0;
			b[s00+1] = 0;
			b[s00  ] = 0;

			break;
		    case(2):
			b[s10+1] = 0;
			b[s10  ] = 1;
			b[s00+1] = 0;
			b[s00  ] = 0;

			break;
		    case(3):
			b[s10+1] = 1;
			b[s10  ] = 1;
			b[s00+1] = 0;
			b[s00  ] = 0;

			break;
		    case(4):
			b[s10+1] = 0;
			b[s10  ] = 0;
			b[s00+1] = 1;
			b[s00  ] = 0;

			break;
		    case(5):
			b[s10+1] = 1;
			b[s10  ] = 0;
			b[s00+1] = 1;
			b[s00  ] = 0;

			break;
		    case(6):
			b[s10+1] = 0;
			b[s10  ] = 1;
			b[s00+1] = 1;
			b[s00  ] = 0;

			break;
		    case(7):
			b[s10+1] = 1;
			b[s10  ] = 1;
			b[s00+1] = 1;
			b[s00  ] = 0;

			break;
		    case(8):
			b[s10+1] = 0;
			b[s10  ] = 0;
			b[s00+1] = 0;
			b[s00  ] = 1;

			break;
		    case(9):
			b[s10+1] = 1;
			b[s10  ] = 0;
			b[s00+1] = 0;
			b[s00  ] = 1;
			break;
		    case(10):
			b[s10+1] = 0;
			b[s10  ] = 1;
			b[s00+1] = 0;
			b[s00  ] = 1;

			break;
		    case(11):
			b[s10+1] = 1;
			b[s10  ] = 1;
			b[s00+1] = 0;
			b[s00  ] = 1;

			break;
		    case(12):
			b[s10+1] = 0;
			b[s10  ] = 0;
			b[s00+1] = 1;
			b[s00  ] = 1;

			break;
		    case(13):
			b[s10+1] = 1;
			b[s10  ] = 0;
			b[s00+1] = 1;
			b[s00  ] = 1;

			break;
		    case(14):
			b[s10+1] = 0;
			b[s10  ] = 1;
			b[s00+1] = 1;
			b[s00  ] = 1;

			break;
		    case(15):
			b[s10+1] = 1;
			b[s10  ] = 1;
			b[s00+1] = 1;
			b[s00  ] = 1;

			break;
		    }
/*
			b[s10+1] =  b[s00]     & 1;
			b[s10  ] = (b[s00]>>1) & 1;
			b[s00+1] = (b[s00]>>2) & 1;
			b[s00  ] = (b[s00]>>3) & 1;
*/

			s00 += 2;
			s10 += 2;
		}

		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */
                        /* not worth converting this to use 16 case statements */
			b[s10  ] = (b[s00]>>1) & 1;
			b[s00  ] = (b[s00]>>3) & 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
                        /* not worth converting this to use 16 case statements */
			b[s00+1] = (b[s00]>>2) & 1;
			b[s00  ] = (b[s00]>>3) & 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
                        /* not worth converting this to use 16 case statements */
			b[s00  ] = (b[s00]>>3) & 1;
		}
	}
}